

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtrule.cpp
# Opt level: O0

void __thiscall
icu_63::DateTimeRule::DateTimeRule
          (DateTimeRule *this,int32_t month,int32_t dayOfMonth,int32_t dayOfWeek,UBool after,
          int32_t millisInDay,TimeRuleType timeType)

{
  int32_t millisInDay_local;
  UBool after_local;
  int32_t dayOfWeek_local;
  int32_t dayOfMonth_local;
  int32_t month_local;
  DateTimeRule *this_local;
  
  memset(this,0,8);
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DateTimeRule_004a79d8;
  this->fMonth = month;
  this->fDayOfMonth = dayOfMonth;
  this->fDayOfWeek = dayOfWeek;
  this->fWeekInMonth = 0;
  this->fMillisInDay = millisInDay;
  this->fTimeRuleType = timeType;
  if (after == '\0') {
    this->fDateRuleType = DOW_LEQ_DOM;
  }
  else {
    this->fDateRuleType = DOW_GEQ_DOM;
  }
  return;
}

Assistant:

DateTimeRule::DateTimeRule(int32_t month,
                           int32_t dayOfMonth,
                           int32_t dayOfWeek,
                           UBool after,
                           int32_t millisInDay,
                           TimeRuleType timeType)
: UObject(),
  fMonth(month), fDayOfMonth(dayOfMonth), fDayOfWeek(dayOfWeek), fWeekInMonth(0), fMillisInDay(millisInDay),
  fTimeRuleType(timeType) {
    if (after) {
        fDateRuleType = DateTimeRule::DOW_GEQ_DOM;
    } else {
        fDateRuleType = DateTimeRule::DOW_LEQ_DOM;
    }
}